

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool Json::containsNewLine(Location begin,Location end)

{
  for (; ((begin < end && (*begin != '\n')) && (*begin != '\r')); begin = begin + 1) {
  }
  return begin < end;
}

Assistant:

static bool containsNewLine(Reader::Location begin, Reader::Location end) {
  for (; begin < end; ++begin)
    if (*begin == '\n' || *begin == '\r')
      return true;
  return false;
}